

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O0

Horizon * __thiscall
icu_63::CalendarAstronomer::eclipticToHorizon
          (CalendarAstronomer *this,Horizon *result,double eclipLong)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double azimuth;
  double altitude;
  double cosL;
  double sinL;
  double cosD;
  double sinD;
  double cosH;
  double sinH;
  double H;
  Equatorial equatorial;
  double eclipLong_local;
  Horizon *result_local;
  CalendarAstronomer *this_local;
  
  equatorial.declination = eclipLong;
  Equatorial::Equatorial((Equatorial *)&H,0.0,0.0);
  eclipticToEquatorial(this,(Equatorial *)&H,equatorial.declination);
  dVar1 = getLocalSidereal(this);
  dVar1 = (dVar1 * 3.141592653589793) / 12.0 - H;
  dVar2 = sin(dVar1);
  dVar1 = cos(dVar1);
  dVar3 = sin(equatorial.ascension);
  dVar4 = cos(equatorial.ascension);
  dVar5 = sin(this->fLatitude);
  dVar6 = cos(this->fLatitude);
  dVar1 = asin(dVar3 * dVar5 + dVar4 * dVar6 * dVar1);
  dVar7 = sin(dVar1);
  dVar2 = atan2(-dVar4 * dVar6 * dVar2,-dVar5 * dVar7 + dVar3);
  Horizon::set(result,dVar2,dVar1);
  return result;
}

Assistant:

CalendarAstronomer::Horizon& CalendarAstronomer::eclipticToHorizon(CalendarAstronomer::Horizon& result, double eclipLong)
{
    Equatorial equatorial;
    eclipticToEquatorial(equatorial, eclipLong);

    double H = getLocalSidereal()*CalendarAstronomer::PI/12 - equatorial.ascension;     // Hour-angle

    double sinH = ::sin(H);
    double cosH = cos(H);
    double sinD = ::sin(equatorial.declination);
    double cosD = cos(equatorial.declination);
    double sinL = ::sin(fLatitude);
    double cosL = cos(fLatitude);

    double altitude = asin(sinD*sinL + cosD*cosL*cosH);
    double azimuth  = atan2(-cosD*cosL*sinH, sinD - sinL * ::sin(altitude));

    result.set(azimuth, altitude);
    return result;
}